

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_4fPoint * __thiscall ON_4fPoint::operator=(ON_4fPoint *this,double *p)

{
  float fVar1;
  
  if (p == (double *)0x0) {
    this->z = 0.0;
    this->x = 0.0;
    this->y = 0.0;
    fVar1 = 1.0;
  }
  else {
    this->x = (float)*p;
    this->y = (float)p[1];
    this->z = (float)p[2];
    fVar1 = (float)p[3];
  }
  this->w = fVar1;
  return this;
}

Assistant:

ON_4fPoint& ON_4fPoint::operator=(const double* p)
{
  if ( p ) {
    x = (float)p[0];
    y = (float)p[1];
    z = (float)p[2];
    w = (float)p[3];
  }
  else {
    x = y = z = 0.0; w = 1.0;
  }
  return *this;
}